

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O1

Status __thiscall
leveldb::DBImpl::RecoverLogFile
          (DBImpl *this,uint64_t log_number,bool last_log,bool *save_manifest,VersionEdit *edit,
          SequenceNumber *max_sequence)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _func_int **pp_Var2;
  undefined8 bytes;
  bool bVar3;
  int iVar4;
  int iVar5;
  SequenceNumber SVar6;
  ulong uVar7;
  size_t sVar8;
  Writer *this_00;
  MemTable *this_01;
  undefined7 in_register_00000011;
  uint64_t number;
  long in_FS_OFFSET;
  ulong *in_stack_00000008;
  uint64_t lfile_size;
  Slice record;
  LogReporter reporter;
  SequentialFile *file;
  Reader reader;
  WriteBatch batch;
  string scratch;
  string fname;
  VersionEdit *local_198;
  Slice local_158;
  undefined1 local_148 [176];
  WriteBatch local_98;
  string local_78;
  string local_58;
  Node *local_38;
  
  number = CONCAT71(in_register_00000011,last_log);
  local_38 = *(Node **)(in_FS_OFFSET + 0x28);
  LogFileName(&local_58,(string *)(log_number + 0x98),number);
  (**(code **)(**(long **)(log_number + 8) + 0x10))
            (this,*(long **)(log_number + 8),&local_58,local_148 + 0x50);
  if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
    local_148._40_8_ = &PTR__Reporter_013e2378;
    local_148._48_8_ = *(undefined8 *)(log_number + 8);
    local_148._56_8_ = *(undefined8 *)(log_number + 0x48);
    local_148._64_8_ = local_58._M_dataplus._M_p;
    local_148._72_8_ = (DBImpl *)0x0;
    if (*(char *)(log_number + 0x3a) != '\0') {
      local_148._72_8_ = this;
    }
    log::Reader::Reader((Reader *)(local_148 + 0x58),(SequentialFile *)local_148._80_8_,
                        (Reporter *)(local_148 + 0x28),true,0);
    Log(*(Logger **)(log_number + 0x48),"Recovering log #%llu",number);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
    local_148._24_8_ = "";
    iVar5 = 0;
    local_148._32_8_ = (_func_int **)0x0;
    WriteBatch::WriteBatch(&local_98);
    local_198 = (VersionEdit *)0x0;
    do {
      while( true ) {
        bVar3 = log::Reader::ReadRecord
                          ((Reader *)(local_148 + 0x58),(Slice *)(local_148 + 0x18),&local_78);
        bytes = local_148._32_8_;
        if (!bVar3 || (this->super_DB)._vptr_DB != (_func_int **)0x0) goto LAB_00d30027;
        if ((_func_int **)0xb < (ulong)local_148._32_8_) break;
        local_148._0_8_ = "log record too small";
        local_148._8_8_ = (Env *)0x14;
        local_158.data_ = local_58._M_dataplus._M_p;
        local_158.size_ = local_58._M_string_length;
        Status::Status((Status *)(local_148 + 0x10),kCorruption,(Slice *)local_148,&local_158);
        RecoverLogFile(unsigned_long,bool,bool*,leveldb::VersionEdit*,unsigned_long*)::LogReporter::
        Corruption(unsigned_long,leveldb::Status_const__
                  (local_148 + 0x28,bytes,(Status *)(local_148 + 0x10));
        if ((_func_int **)local_148._16_8_ != (_func_int **)0x0) {
          operator_delete__((void *)local_148._16_8_);
        }
      }
      WriteBatchInternal::SetContents(&local_98,(Slice *)(local_148 + 0x18));
      if (local_198 == (VersionEdit *)0x0) {
        local_198 = (VersionEdit *)operator_new(0x70);
        MemTable::MemTable((MemTable *)local_198,(InternalKeyComparator *)(log_number + 0x10));
        paVar1 = &(local_198->comparator_).field_2;
        *(int *)paVar1 = *(int *)paVar1 + 1;
      }
      WriteBatchInternal::InsertInto((WriteBatch *)local_148,(MemTable *)&local_98);
      pp_Var2 = (this->super_DB)._vptr_DB;
      (this->super_DB)._vptr_DB = (_func_int **)local_148._0_8_;
      local_148._0_8_ = pp_Var2;
      if (pp_Var2 != (_func_int **)0x0) {
        operator_delete__(pp_Var2);
      }
      MaybeIgnoreError((DBImpl *)log_number,(Status *)this);
      if ((this->super_DB)._vptr_DB != (_func_int **)0x0) break;
      SVar6 = WriteBatchInternal::Sequence(&local_98);
      iVar4 = WriteBatchInternal::Count(&local_98);
      uVar7 = ((long)iVar4 + SVar6) - 1;
      if (*in_stack_00000008 < uVar7) {
        *in_stack_00000008 = uVar7;
      }
      sVar8 = MemTable::ApproximateMemoryUsage((MemTable *)local_198);
      bVar3 = true;
      if (*(ulong *)(log_number + 0x50) < sVar8) {
        *(undefined1 *)&(edit->comparator_)._M_dataplus._M_p = 1;
        WriteLevel0Table((DBImpl *)local_148,(MemTable *)log_number,local_198,
                         (Version *)max_sequence);
        pp_Var2 = (this->super_DB)._vptr_DB;
        (this->super_DB)._vptr_DB = (_func_int **)local_148._0_8_;
        local_148._0_8_ = pp_Var2;
        if (pp_Var2 != (_func_int **)0x0) {
          operator_delete__(pp_Var2);
        }
        iVar5 = iVar5 + 1;
        MemTable::Unref((MemTable *)local_198);
        bVar3 = (this->super_DB)._vptr_DB == (_func_int **)0x0;
        local_198 = (VersionEdit *)0x0;
      }
    } while (bVar3);
LAB_00d30027:
    if ((SequentialFile *)local_148._80_8_ != (SequentialFile *)0x0) {
      (*(*(_func_int ***)local_148._80_8_)[1])();
    }
    if (((this->super_DB)._vptr_DB == (_func_int **)0x0) &&
       (((byte)save_manifest & *(byte *)(log_number + 0x84) & iVar5 == 0) == 1)) {
      if (*(long *)(log_number + 0x148) != 0) {
        __assert_fail("logfile_ == nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/db_impl.cc"
                      ,0x1d5,
                      "Status leveldb::DBImpl::RecoverLogFile(uint64_t, bool, bool *, VersionEdit *, SequenceNumber *)"
                     );
      }
      if (*(long *)(log_number + 0x158) != 0) {
        __assert_fail("log_ == nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/db_impl.cc"
                      ,0x1d6,
                      "Status leveldb::DBImpl::RecoverLogFile(uint64_t, bool, bool *, VersionEdit *, SequenceNumber *)"
                     );
      }
      if (*(long *)(log_number + 0x130) != 0) {
        __assert_fail("mem_ == nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/db_impl.cc"
                      ,0x1d7,
                      "Status leveldb::DBImpl::RecoverLogFile(uint64_t, bool, bool *, VersionEdit *, SequenceNumber *)"
                     );
      }
      (**(code **)(**(long **)(log_number + 8) + 0x58))
                (&local_158,*(long **)(log_number + 8),&local_58,local_148);
      if (local_158.data_ == (pointer)0x0) {
        (**(code **)(**(long **)(log_number + 8) + 0x28))
                  (local_148 + 0x10,*(long **)(log_number + 8),&local_58,
                   (undefined8 *)(log_number + 0x148));
        bVar3 = (_func_int **)local_148._16_8_ == (_func_int **)0x0;
        if ((_func_int **)local_148._16_8_ != (_func_int **)0x0) {
          operator_delete__((void *)local_148._16_8_);
        }
      }
      else {
        bVar3 = false;
      }
      if (local_158.data_ != (pointer)0x0) {
        operator_delete__(local_158.data_);
      }
      if (bVar3) {
        Log(*(Logger **)(log_number + 0x48),"Reusing old log %s \n",local_58._M_dataplus._M_p);
        this_00 = (Writer *)operator_new(0x20);
        log::Writer::Writer(this_00,*(WritableFile **)(log_number + 0x148),local_148._0_8_);
        *(Writer **)(log_number + 0x158) = this_00;
        *(uint64_t *)(log_number + 0x150) = number;
        if (local_198 == (VersionEdit *)0x0) {
          this_01 = (MemTable *)operator_new(0x70);
          MemTable::MemTable(this_01,(InternalKeyComparator *)(log_number + 0x10));
          *(MemTable **)(log_number + 0x130) = this_01;
          this_01->refs_ = this_01->refs_ + 1;
        }
        else {
          *(VersionEdit **)(log_number + 0x130) = local_198;
        }
        local_198 = (VersionEdit *)0x0;
      }
    }
    if (local_198 != (VersionEdit *)0x0) {
      if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
        *(undefined1 *)&(edit->comparator_)._M_dataplus._M_p = 1;
        WriteLevel0Table((DBImpl *)local_148,(MemTable *)log_number,local_198,
                         (Version *)max_sequence);
        pp_Var2 = (this->super_DB)._vptr_DB;
        (this->super_DB)._vptr_DB = (_func_int **)local_148._0_8_;
        local_148._0_8_ = pp_Var2;
        if (pp_Var2 != (_func_int **)0x0) {
          operator_delete__(pp_Var2);
        }
      }
      MemTable::Unref((MemTable *)local_198);
    }
    WriteBatch::~WriteBatch(&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,
                      CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                               local_78.field_2._M_local_buf[0]) + 1);
    }
    log::Reader::~Reader((Reader *)(local_148 + 0x58));
    log::Reader::Reporter::~Reporter((Reporter *)(local_148 + 0x28));
  }
  else {
    MaybeIgnoreError((DBImpl *)log_number,(Status *)this);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (*(Node **)(in_FS_OFFSET + 0x28) == local_38) {
    return (Status)(char *)this;
  }
  __stack_chk_fail();
}

Assistant:

Status DBImpl::RecoverLogFile(uint64_t log_number, bool last_log,
                              bool* save_manifest, VersionEdit* edit,
                              SequenceNumber* max_sequence) {
  struct LogReporter : public log::Reader::Reporter {
    Env* env;
    Logger* info_log;
    const char* fname;
    Status* status;  // null if options_.paranoid_checks==false
    void Corruption(size_t bytes, const Status& s) override {
      Log(info_log, "%s%s: dropping %d bytes; %s",
          (this->status == nullptr ? "(ignoring error) " : ""), fname,
          static_cast<int>(bytes), s.ToString().c_str());
      if (this->status != nullptr && this->status->ok()) *this->status = s;
    }
  };

  mutex_.AssertHeld();

  // Open the log file
  std::string fname = LogFileName(dbname_, log_number);
  SequentialFile* file;
  Status status = env_->NewSequentialFile(fname, &file);
  if (!status.ok()) {
    MaybeIgnoreError(&status);
    return status;
  }

  // Create the log reader.
  LogReporter reporter;
  reporter.env = env_;
  reporter.info_log = options_.info_log;
  reporter.fname = fname.c_str();
  reporter.status = (options_.paranoid_checks ? &status : nullptr);
  // We intentionally make log::Reader do checksumming even if
  // paranoid_checks==false so that corruptions cause entire commits
  // to be skipped instead of propagating bad information (like overly
  // large sequence numbers).
  log::Reader reader(file, &reporter, true /*checksum*/, 0 /*initial_offset*/);
  Log(options_.info_log, "Recovering log #%llu",
      (unsigned long long)log_number);

  // Read all the records and add to a memtable
  std::string scratch;
  Slice record;
  WriteBatch batch;
  int compactions = 0;
  MemTable* mem = nullptr;
  while (reader.ReadRecord(&record, &scratch) && status.ok()) {
    if (record.size() < 12) {
      reporter.Corruption(record.size(),
                          Status::Corruption("log record too small", fname));
      continue;
    }
    WriteBatchInternal::SetContents(&batch, record);

    if (mem == nullptr) {
      mem = new MemTable(internal_comparator_);
      mem->Ref();
    }
    status = WriteBatchInternal::InsertInto(&batch, mem);
    MaybeIgnoreError(&status);
    if (!status.ok()) {
      break;
    }
    const SequenceNumber last_seq = WriteBatchInternal::Sequence(&batch) +
                                    WriteBatchInternal::Count(&batch) - 1;
    if (last_seq > *max_sequence) {
      *max_sequence = last_seq;
    }

    if (mem->ApproximateMemoryUsage() > options_.write_buffer_size) {
      compactions++;
      *save_manifest = true;
      status = WriteLevel0Table(mem, edit, nullptr);
      mem->Unref();
      mem = nullptr;
      if (!status.ok()) {
        // Reflect errors immediately so that conditions like full
        // file-systems cause the DB::Open() to fail.
        break;
      }
    }
  }

  delete file;

  // See if we should keep reusing the last log file.
  if (status.ok() && options_.reuse_logs && last_log && compactions == 0) {
    assert(logfile_ == nullptr);
    assert(log_ == nullptr);
    assert(mem_ == nullptr);
    uint64_t lfile_size;
    if (env_->GetFileSize(fname, &lfile_size).ok() &&
        env_->NewAppendableFile(fname, &logfile_).ok()) {
      Log(options_.info_log, "Reusing old log %s \n", fname.c_str());
      log_ = new log::Writer(logfile_, lfile_size);
      logfile_number_ = log_number;
      if (mem != nullptr) {
        mem_ = mem;
        mem = nullptr;
      } else {
        // mem can be nullptr if lognum exists but was empty.
        mem_ = new MemTable(internal_comparator_);
        mem_->Ref();
      }
    }
  }

  if (mem != nullptr) {
    // mem did not get reused; compact it.
    if (status.ok()) {
      *save_manifest = true;
      status = WriteLevel0Table(mem, edit, nullptr);
    }
    mem->Unref();
  }

  return status;
}